

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

AllocList *
absl::lts_20250127::base_internal::LLA_SkiplistSearch(AllocList *head,AllocList *e,AllocList **prev)

{
  uint uVar1;
  AllocList *pAVar2;
  ulong uVar3;
  
  uVar1 = head->levels;
  uVar3 = (ulong)uVar1;
  do {
    if ((int)uVar3 < 1) {
      if ((ulong)uVar1 != 0) {
        return (*prev)->next[0];
      }
      return (AllocList *)0x0;
    }
    pAVar2 = head;
    do {
      head = pAVar2;
      pAVar2 = head->next[uVar3 - 1];
      if (pAVar2 == (AllocList *)0x0) break;
    } while (pAVar2 < e);
    prev[uVar3 - 1] = head;
    uVar3 = uVar3 - 1;
  } while( true );
}

Assistant:

static AllocList *LLA_SkiplistSearch(AllocList *head, AllocList *e,
                                     AllocList **prev) {
  AllocList *p = head;
  for (int level = head->levels - 1; level >= 0; level--) {
    for (AllocList *n; (n = p->next[level]) != nullptr && n < e; p = n) {
    }
    prev[level] = p;
  }
  return (head->levels == 0) ? nullptr : prev[0]->next[0];
}